

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O0

void __thiscall BufferedReader::deleteReader(BufferedReader *this,int readerID)

{
  bool bVar1;
  pointer ppVar2;
  ReaderData *data;
  _Self local_40 [3];
  _Self local_28;
  iterator iterator;
  lock_guard<std::mutex> lock;
  int readerID_local;
  BufferedReader *this_local;
  
  lock._M_device._4_4_ = readerID;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&iterator,&this->m_readersMtx);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::find(&this->m_readers,(key_type_conflict *)((long)&lock._M_device + 4));
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_ReaderData_*,_std::less<int>,_std::allocator<std::pair<const_int,_ReaderData_*>_>_>
       ::end(&this->m_readers);
  bVar1 = std::operator==(&local_28,local_40);
  if (!bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator->(&local_28);
    if (ppVar2->second->m_atQueue < 1) {
      ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_ReaderData_*>_>::operator->(&local_28);
      if (ppVar2->second != (ReaderData *)0x0) {
        (*ppVar2->second->_vptr_ReaderData[1])();
      }
      std::map<int,ReaderData*,std::less<int>,std::allocator<std::pair<int_const,ReaderData*>>>::
      erase_abi_cxx11_((map<int,ReaderData*,std::less<int>,std::allocator<std::pair<int_const,ReaderData*>>>
                        *)&this->m_readers,(iterator)local_28._M_node);
    }
    else {
      ppVar2->second->m_deleted = true;
    }
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&iterator);
  return;
}

Assistant:

void BufferedReader::deleteReader(const int readerID)
{
    {
        std::lock_guard lock(m_readersMtx);
        const auto iterator = m_readers.find(readerID);
        if (iterator == m_readers.end())
            return;
        ReaderData* data = iterator->second;
        if (data->m_atQueue > 0)
            data->m_deleted = true;  // There are requests in the queue for reading into this structure.
        else
        {
            delete iterator->second;  // No outstanding requests for reading in the queue. Delete immediately.
            m_readers.erase(iterator);
        }
    }
}